

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OjaNewton.cc
# Opt level: O0

void __thiscall OjaNewton::initialize_Z(OjaNewton *this,parameters *weights)

{
  weight *pwVar1;
  uint uVar2;
  long *in_RDI;
  float fVar3;
  float fVar4;
  double dVar5;
  double dVar6;
  uint32_t i_6;
  uint32_t i_5;
  double norm;
  uint32_t i_4;
  uint32_t i_3;
  double tmp;
  int k;
  int j_1;
  int j;
  float r2;
  float r1;
  weight *w;
  uint32_t i_2;
  double PI2;
  int i_1;
  uint32_t i;
  uint32_t length;
  undefined4 in_stack_ffffffffffffff60;
  float in_stack_ffffffffffffff64;
  parameters *in_stack_ffffffffffffff68;
  uint local_70;
  uint local_6c;
  double local_68;
  uint local_60;
  uint local_5c;
  int local_4c;
  int local_48;
  int local_44;
  uint local_2c;
  int local_1c;
  uint local_18;
  
  uVar2 = 1 << ((byte)*(undefined4 *)(*in_RDI + 0x50) & 0x1f);
  if ((*(byte *)((long)in_RDI + 0xac) & 1) != 0) {
    for (local_18 = 0; local_18 < uVar2; local_18 = local_18 + 1) {
      pwVar1 = parameters::strided_index
                         (in_stack_ffffffffffffff68,
                          CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      pwVar1[(int)in_RDI[1] + 1] = 0.1;
    }
  }
  if ((*(byte *)((long)in_RDI + 0xad) & 1) == 0) {
    for (local_1c = 1; local_1c <= (int)in_RDI[1]; local_1c = local_1c + 1) {
      pwVar1 = parameters::strided_index
                         (in_stack_ffffffffffffff68,
                          CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      pwVar1[local_1c] = 1.0;
    }
  }
  else {
    for (local_2c = 0; local_2c < uVar2; local_2c = local_2c + 1) {
      pwVar1 = parameters::strided_index
                         (in_stack_ffffffffffffff68,
                          CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      for (local_44 = 1; local_44 <= (int)in_RDI[1]; local_44 = local_44 + 1) {
        do {
          fVar3 = merand48((uint64_t *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
                          );
          fVar4 = merand48((uint64_t *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
                          );
        } while (fVar3 == 0.0);
        dVar6 = std::log((double)(ulong)(uint)fVar3);
        dVar6 = std::sqrt((double)(ulong)(uint)(SUB84(dVar6,0) * -2.0));
        dVar5 = cos((double)fVar4 * 6.2831854820251465);
        pwVar1[local_44] = SUB84(dVar6,0) * (float)dVar5;
      }
    }
  }
  for (local_48 = 1; local_48 <= (int)in_RDI[1]; local_48 = local_48 + 1) {
    for (local_4c = 1; local_4c <= local_48 + -1; local_4c = local_4c + 1) {
      fVar3 = 0.0;
      for (local_5c = 0; local_5c < uVar2; local_5c = local_5c + 1) {
        pwVar1 = parameters::strided_index
                           (in_stack_ffffffffffffff68,
                            CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
        fVar4 = pwVar1[local_48];
        pwVar1 = parameters::strided_index
                           (in_stack_ffffffffffffff68,
                            CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
        fVar3 = fVar4 * pwVar1[local_4c] + fVar3;
      }
      for (local_60 = 0; local_60 < uVar2; local_60 = local_60 + 1) {
        pwVar1 = parameters::strided_index
                           (in_stack_ffffffffffffff68,
                            CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
        fVar4 = pwVar1[local_4c];
        pwVar1 = parameters::strided_index
                           (in_stack_ffffffffffffff68,
                            CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
        pwVar1[local_48] = -fVar3 * fVar4 + pwVar1[local_48];
      }
    }
    local_68 = 0.0;
    for (local_6c = 0; local_6c < uVar2; local_6c = local_6c + 1) {
      pwVar1 = parameters::strided_index
                         (in_stack_ffffffffffffff68,
                          CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      in_stack_ffffffffffffff68 = (parameters *)(double)pwVar1[local_48];
      pwVar1 = parameters::strided_index
                         (in_stack_ffffffffffffff68,
                          CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      local_68 = (double)in_stack_ffffffffffffff68 * (double)pwVar1[local_48] + local_68;
    }
    dVar6 = sqrt(local_68);
    for (local_70 = 0; local_70 < uVar2; local_70 = local_70 + 1) {
      in_stack_ffffffffffffff64 = (float)dVar6;
      pwVar1 = parameters::strided_index
                         (in_stack_ffffffffffffff68,
                          CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
      pwVar1[local_48] = pwVar1[local_48] / in_stack_ffffffffffffff64;
    }
  }
  return;
}

Assistant:

void initialize_Z(parameters& weights)
  {
    uint32_t length = 1 << all->num_bits;
    if (normalize)  // initialize normalization part
    {
      for (uint32_t i = 0; i < length; i++) (&(weights.strided_index(i)))[NORM2] = 0.1f;
    }
    if (!random_init)
    {
      // simple initialization
      for (int i = 1; i <= m; i++) (&(weights.strided_index(i)))[i] = 1.f;
    }
    else
    {
      // more complicated initialization: orthgonal basis of a random matrix

      const double PI2 = 2.f * 3.1415927f;

      for (uint32_t i = 0; i < length; i++)
      {
        weight& w = weights.strided_index(i);
        float r1, r2;
        for (int j = 1; j <= m; j++)
        {
          //box-muller tranform: https://en.wikipedia.org/wiki/Box%E2%80%93Muller_transform
          //redraw until r1 should be strictly positive
          do
          {
            r1 = merand48(all->random_state);
            r2 = merand48(all->random_state);
          } while (r1 == 0.f);

          (&w)[j] = sqrt(-2.f * log(r1)) * (float)cos(PI2 * r2);
        }
      }
    }

    // Gram-Schmidt
    for (int j = 1; j <= m; j++)
    {
      for (int k = 1; k <= j - 1; k++)
      {
        double tmp = 0;

        for (uint32_t i = 0; i < length; i++)
          tmp += ((double)(&(weights.strided_index(i)))[j]) * (&(weights.strided_index(i)))[k];
        for (uint32_t i = 0; i < length; i++)
          (&(weights.strided_index(i)))[j] -= (float)tmp * (&(weights.strided_index(i)))[k];
      }
      double norm = 0;
      for (uint32_t i = 0; i < length; i++)
        norm += ((double)(&(weights.strided_index(i)))[j]) * (&(weights.strided_index(i)))[j];
      norm = sqrt(norm);
      for (uint32_t i = 0; i < length; i++) (&(weights.strided_index(i)))[j] /= (float)norm;
    }
  }